

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cone.cpp
# Opt level: O0

Tuple4d * __thiscall
geometry::primitive::Cone::local_normal
          (Tuple4d *__return_storage_ptr__,Cone *this,Tuple4d *point,Intersection *hit)

{
  double *pdVar1;
  int iVar2;
  Tuple4d *pTVar3;
  double dVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double y;
  double distance;
  Intersection *hit_local;
  Tuple4d *point_local;
  Cone *this_local;
  
  pdVar1 = math::Tuple4d::operator()(point,0);
  dVar4 = pow(*pdVar1,2.0);
  pTVar3 = point;
  pdVar1 = math::Tuple4d::operator()(point,2);
  iVar2 = (int)pTVar3;
  dVar5 = pow(*pdVar1,2.0);
  dVar4 = dVar4 + dVar5;
  if (((this->m_closed & 1U) != 0) && (std::abs(iVar2), dVar4 + 1e-05 < extraout_XMM0_Qa)) {
    pTVar3 = point;
    pdVar1 = math::Tuple4d::operator()(point,1);
    iVar2 = (int)pTVar3;
    if (this->m_minmax[1] - 1e-05 <= *pdVar1) {
      math::vector(__return_storage_ptr__,0.0,1.0,0.0);
      return __return_storage_ptr__;
    }
  }
  if ((((this->m_closed & 1U) != 0) && (std::abs(iVar2), dVar4 + 1e-05 < extraout_XMM0_Qa_00)) &&
     (pdVar1 = math::Tuple4d::operator()(point,1), *pdVar1 <= this->m_minmax[0] + 1e-05)) {
    math::vector(__return_storage_ptr__,0.0,-1.0,0.0);
    return __return_storage_ptr__;
  }
  dVar5 = sqrt(dVar4);
  pdVar1 = math::Tuple4d::operator()(point,1);
  iVar2 = 1;
  if (dVar5 * (double)(0.0 < *pdVar1) != 0.0) {
    iVar2 = -1;
  }
  pdVar1 = math::Tuple4d::operator()(point,0);
  dVar5 = *pdVar1;
  pdVar1 = math::Tuple4d::operator()(point,2);
  math::vector(__return_storage_ptr__,dVar5,(double)iVar2,*pdVar1);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cone::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double distance = pow(point(0), 2) + pow(point(2), 2);
    if (m_closed &&
	distance + constants::EPSILON < std::abs(m_minmax[1]) &&
	point(1) >= m_minmax[1] - constants::EPSILON)
	return math::vector(0, 1, 0);
    else if (m_closed &&
	     distance + constants::EPSILON < std::abs(m_minmax[0]) &&
	     point(1) <= m_minmax[0] + constants::EPSILON)
	return math::vector(0, -1, 0);

    double y = sqrt(distance) * (point(1) > 0) ? -1 : 1;
    return math::vector(point(0), y, point(2));
}